

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

int __thiscall
CVmObjList::set_index_val_q
          (CVmObjList *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val,vm_val_t *new_val)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  
  pvVar2 = sp_;
  pvVar1 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar1 = VM_OBJ;
  (pvVar2->val).obj = self;
  set_index_list(result,(this->super_CVmObjCollection).super_CVmObject.ext_,index_val,new_val);
  sp_ = sp_ + -1;
  return 1;
}

Assistant:

int CVmObjList::set_index_val_q(VMG_ vm_val_t *result, vm_obj_id_t self,
                                const vm_val_t *index_val,
                                const vm_val_t *new_val)
{
    /* put the list on the stack to avoid garbage collection */
    G_stk->push()->set_obj(self);
    
    /* 
     *   use the constant list set-index routine, using our extension data
     *   as the list data 
     */
    set_index_list(vmg_ result, ext_, index_val, new_val);

    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}